

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileFStream::OpenChain
          (FileFStream *this,string *name,Mode openMode,Comm *chainComm,bool async,bool directio)

{
  int iVar1;
  _Ios_Openmode _Var2;
  _Ios_Openmode __a;
  int iVar3;
  undefined4 in_EDX;
  FileFStream *in_RSI;
  long *in_RDI;
  byte in_R8B;
  byte in_R9B;
  int token;
  type lf_AsyncOpenWrite;
  char *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  Transport *in_stack_fffffffffffffce0;
  allocator *paVar4;
  FileFStream *in_stack_fffffffffffffd10;
  allocator *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  type *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  launch __policy;
  string *in_stack_fffffffffffffd68;
  FileFStream *in_stack_fffffffffffffd70;
  allocator local_231;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  int in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  int *in_stack_fffffffffffffde0;
  Comm *in_stack_fffffffffffffde8;
  Comm *in_stack_fffffffffffffdf0;
  string local_208 [8];
  string *in_stack_fffffffffffffe00;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [95];
  allocator local_59;
  string local_58 [36];
  undefined4 local_34;
  byte local_22;
  byte local_21;
  undefined4 local_14;
  FileFStream *local_10;
  
  __policy = (launch)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_34 = 1;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::string::operator=((string *)(in_RDI + 9),(string *)in_RSI);
  (**(code **)(*in_RDI + 0x98))();
  iVar1 = helper::Comm::Rank((Comm *)0xd5a7e6);
  if (0 < iVar1) {
    helper::Comm::Rank((Comm *)0xd5a804);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Chain token in FileFStream::OpenChain",&local_59);
    helper::Comm::Recv<int>
              (in_stack_fffffffffffffdf0,(int *)in_stack_fffffffffffffde8,
               (size_t)in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8
               ,in_stack_fffffffffffffe00);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  *(undefined4 *)(in_RDI + 0xd) = local_14;
  iVar1 = (int)in_RDI[0xd];
  if (iVar1 == 1) {
    if (((local_21 & 1) == 0) || (iVar1 = helper::Comm::Size((Comm *)0xd5a943), iVar1 != 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"open",&local_b9);
      Transport::ProfilerStart
                (in_stack_fffffffffffffce0,
                 (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      iVar1 = helper::Comm::Rank((Comm *)0xd5aa16);
      if (iVar1 == 0) {
        in_stack_fffffffffffffd68 = (string *)(in_RDI + 0x1e);
        _Var2 = std::operator|(_S_out,_S_bin);
        std::operator|(_Var2,_S_trunc);
        std::fstream::open((string *)in_stack_fffffffffffffd68,(_Ios_Openmode)local_10);
        in_stack_fffffffffffffd70 = local_10;
      }
      else {
        std::operator|(_S_out,_S_bin);
        std::fstream::open((string *)(in_RDI + 0x1e),(_Ios_Openmode)local_10);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"open",&local_e1);
      Transport::ProfilerStop
                (in_stack_fffffffffffffce0,
                 (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
    else {
      *(undefined1 *)(in_RDI + 0x60) = 1;
      std::
      async<adios2::transport::FileFStream::OpenChain(std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm_const&,bool,bool)::__0&,std::__cxx11::string_const&>
                (__policy,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      std::future<void>::operator=
                ((future<void> *)in_stack_fffffffffffffce0,
                 (future<void> *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
      std::future<void>::~future((future<void> *)0xd5a9a2);
    }
  }
  else if (iVar1 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"open",&local_159);
    Transport::ProfilerStart
              (in_stack_fffffffffffffce0,
               (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::operator|(_S_in,_S_bin);
    std::fstream::open((string *)(in_RDI + 0x1e),(_Ios_Openmode)local_10);
    in_stack_fffffffffffffd18 = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"open",in_stack_fffffffffffffd18);
    Transport::ProfilerStop
              (in_stack_fffffffffffffce0,
               (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    in_stack_fffffffffffffd10 = local_10;
  }
  else if (iVar1 == 3) {
    paVar4 = &local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"open",paVar4);
    Transport::ProfilerStart
              (in_stack_fffffffffffffce0,
               (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    _Var2 = (_Ios_Openmode)local_10;
    __a = std::operator|(_S_in,_S_out);
    std::operator|(__a,_S_bin);
    std::fstream::open((string *)(in_RDI + 0x1e),_Var2);
    std::ostream::seekp((long)(in_RDI + 0x20),_S_beg);
    paVar4 = &local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"open",paVar4);
    Transport::ProfilerStop
              (in_stack_fffffffffffffce0,
               (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
  }
  else {
    std::operator+((char *)in_stack_fffffffffffffd18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd0);
    CheckFile(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
  }
  if ((*(byte *)(in_RDI + 0x60) & 1) == 0) {
    std::operator+((char *)in_stack_fffffffffffffd18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8),
                   in_stack_fffffffffffffcd0);
    CheckFile(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_208);
    *(undefined1 *)((long)in_RDI + 0x6c) = 1;
  }
  iVar1 = helper::Comm::Rank((Comm *)0xd5afe6);
  iVar3 = helper::Comm::Size((Comm *)0xd5aff7);
  if (iVar1 < iVar3 + -1) {
    helper::Comm::Rank((Comm *)0xd5b01a);
    paVar4 = &local_231;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffdd0,"Sending Chain token in FileFStream::OpenChain",
               paVar4);
    helper::Comm::Isend<int>
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
               in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,in_stack_fffffffffffffe00);
    helper::Comm::Req::~Req((Req *)0xd5b091);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  return;
}

Assistant:

void FileFStream::OpenChain(const std::string &name, Mode openMode, const helper::Comm &chainComm,
                            const bool async, const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> void {
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
        ProfilerStop("open");
    };

    int token = 1;
    m_Name = name;
    CheckName();

    if (chainComm.Rank() > 0)
    {
        chainComm.Recv(&token, 1, chainComm.Rank() - 1, 0, "Chain token in FileFStream::OpenChain");
    }

    m_OpenMode = openMode;
    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async && chainComm.Size() == 1)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            ProfilerStart("open");
            if (chainComm.Rank() == 0)
            {
                m_FileStream.open(name,
                                  std::fstream::out | std::fstream::binary | std::fstream::trunc);
            }
            else
            {
                m_FileStream.open(name, std::fstream::out | std::fstream::binary);
            }
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::out | std::fstream::binary);
        m_FileStream.seekp(0, std::ios_base::end);
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::binary);
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to stream open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to fstream open");
        m_IsOpen = true;
    }

    if (chainComm.Rank() < chainComm.Size() - 1)
    {
        chainComm.Isend(&token, 1, chainComm.Rank() + 1, 0,
                        "Sending Chain token in FileFStream::OpenChain");
    }
}